

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly345.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Poly345::Get_y_dx(ChFunction_Poly345 *this,double x)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  double __x;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  dVar3 = 0.0;
  if ((0.0 < x) && (dVar1 = this->end, x < dVar1)) {
    __x = x / dVar1;
    dVar3 = this->h;
    dVar4 = pow(__x,3.0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = __x * __x;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar4 * -60.0;
    auVar2 = vfmadd231sd_fma(auVar5,ZEXT816(0x403e000000000000),auVar2);
    auVar6._0_8_ = pow(__x,4.0);
    auVar6._8_56_ = extraout_var;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar2._0_8_;
    auVar2 = vfmadd132sd_fma(auVar6._0_16_,auVar7,ZEXT816(0x403e000000000000));
    dVar3 = auVar2._0_8_ * (1.0 / dVar1) * dVar3;
  }
  return dVar3;
}

Assistant:

double ChFunction_Poly345::Get_y_dx(double x) const {
    double ret = 0;
    if (x <= 0)
        return 0;
    if (x >= end)
        return 0;
    double a = x / end;
    ret = h * (1 / end) * (30 * pow(a, 2) - 60 * pow(a, 3) + 30 * pow(a, 4));
    return ret;
}